

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O1

Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover)

{
  Vec_Int_t *p;
  Vec_Int_t *vEdgeLits;
  Dec_Node_t *pDVar1;
  size_t sVar2;
  int iVar3;
  Dec_Edge_t DVar4;
  Dec_Edge_t DVar5;
  void *pvVar6;
  Dec_Node_t *pDVar7;
  Mvc_Cover_t *pSimple;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pDiv;
  Mvc_Cover_t *local_48;
  Mvc_Cover_t *local_40;
  Mvc_Cover_t *local_38;
  
  iVar3 = Mvc_CoverReadCubeNum(pCover);
  if (iVar3 == 0) {
    __assert_fail("Mvc_CoverReadCubeNum(pCover)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                  ,0x73,"Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *, Mvc_Cover_t *)");
  }
  local_38 = Mvc_CoverDivisor(pCover);
  if (local_38 != (Mvc_Cover_t *)0x0) {
    Mvc_CoverDivideInternal(pCover,local_38,&local_48,&local_40);
    iVar3 = Mvc_CoverReadCubeNum(local_48);
    if (iVar3 == 0) {
      __assert_fail("Mvc_CoverReadCubeNum(pQuo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                    ,0x7c,"Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *, Mvc_Cover_t *)");
    }
    Mvc_CoverFree(local_38);
    Mvc_CoverFree(local_40);
    iVar3 = Mvc_CoverReadCubeNum(local_48);
    if (iVar3 == 1) {
      DVar4 = Dec_FactorLF_rec(pFForm,pCover,local_48);
      pSimple = local_48;
    }
    else {
      Mvc_CoverMakeCubeFree(local_48);
      Mvc_CoverDivideInternal(pCover,local_48,&local_38,&local_40);
      iVar3 = Mvc_CoverIsCubeFree(local_38);
      if (iVar3 == 0) {
        pSimple = Mvc_CoverCommonCubeCover(local_38);
        Mvc_CoverFree(local_38);
        Mvc_CoverFree(local_48);
        Mvc_CoverFree(local_40);
        DVar4 = Dec_FactorLF_rec(pFForm,pCover,pSimple);
      }
      else {
        DVar4 = Dec_Factor_rec(pFForm,local_38);
        DVar5 = Dec_Factor_rec(pFForm,local_48);
        Mvc_CoverFree(local_38);
        Mvc_CoverFree(local_48);
        if (pFForm->nSize == pFForm->nCap) {
          sVar2 = (long)pFForm->nCap * 0x30;
          if (pFForm->pNodes == (Dec_Node_t *)0x0) {
            pDVar7 = (Dec_Node_t *)malloc(sVar2);
          }
          else {
            pDVar7 = (Dec_Node_t *)realloc(pFForm->pNodes,sVar2);
          }
          pFForm->pNodes = pDVar7;
          pFForm->nCap = pFForm->nCap << 1;
        }
        pDVar1 = pFForm->pNodes;
        iVar3 = pFForm->nSize;
        pFForm->nSize = iVar3 + 1;
        pDVar7 = pDVar1 + iVar3;
        pDVar7->eEdge0 = (Dec_Edge_t)0x0;
        pDVar7->eEdge1 = (Dec_Edge_t)0x0;
        (pDVar7->field_2).pFunc = (void *)0x0;
        *(undefined8 *)&pDVar1[iVar3].field_0x10 = 0;
        pDVar1[iVar3].eEdge0 = DVar4;
        pDVar1[iVar3].eEdge1 = DVar5;
        *(uint *)&pDVar1[iVar3].field_0x10 = ((uint)DVar5 & 1) << 0x10 | ((uint)DVar4 & 1) << 0xf;
        DVar4 = (Dec_Edge_t)(pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
        iVar3 = Mvc_CoverReadCubeNum(local_40);
        pSimple = local_40;
        if (iVar3 != 0) {
          DVar5 = Dec_Factor_rec(pFForm,local_40);
          Mvc_CoverFree(local_40);
          if (pFForm->nSize == pFForm->nCap) {
            sVar2 = (long)pFForm->nCap * 0x30;
            if (pFForm->pNodes == (Dec_Node_t *)0x0) {
              pDVar7 = (Dec_Node_t *)malloc(sVar2);
            }
            else {
              pDVar7 = (Dec_Node_t *)realloc(pFForm->pNodes,sVar2);
            }
            pFForm->pNodes = pDVar7;
            pFForm->nCap = pFForm->nCap << 1;
          }
          pDVar1 = pFForm->pNodes;
          iVar3 = pFForm->nSize;
          pFForm->nSize = iVar3 + 1;
          pDVar7 = pDVar1 + iVar3;
          pDVar7->eEdge0 = (Dec_Edge_t)0x0;
          pDVar7->eEdge1 = (Dec_Edge_t)0x0;
          (pDVar7->field_2).pFunc = (void *)0x0;
          *(undefined8 *)&pDVar1[iVar3].field_0x10 = 0;
          *(uint *)&pDVar1[iVar3].field_0x10 = ((uint)DVar5 & 1) << 0x10 | 0x4000;
          pDVar1[iVar3].eEdge0 = (Dec_Edge_t)((uint)DVar4 | 1);
          pDVar1[iVar3].eEdge1 = (Dec_Edge_t)((uint)DVar5 ^ 1);
          return (Dec_Edge_t)((pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
        }
      }
    }
    Mvc_CoverFree(pSimple);
    return DVar4;
  }
  pvVar6 = Abc_FrameReadManDec();
  p = *(Vec_Int_t **)((long)pvVar6 + 8);
  vEdgeLits = *(Vec_Int_t **)((long)pvVar6 + 0x10);
  p->nSize = 0;
  for (pCube = (pCover->lCubes).pHead; pCube != (Mvc_Cube_t *)0x0; pCube = pCube->pNext) {
    DVar4 = Dec_FactorTrivialCube(pFForm,pCover,pCube,vEdgeLits);
    Vec_IntPush(p,(int)DVar4);
  }
  DVar4 = Dec_FactorTrivialTree_rec(pFForm,(Dec_Edge_t *)p->pArray,p->nSize,1);
  return DVar4;
}

Assistant:

Dec_Edge_t Dec_Factor_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pDiv, * pQuo, * pRem, * pCom;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd, eNode;

    // make sure the cover contains some cubes
    assert( Mvc_CoverReadCubeNum(pCover) );

    // get the divisor
    pDiv = Mvc_CoverDivisor( pCover );
    if ( pDiv == NULL )
        return Dec_FactorTrivial( pFForm, pCover );

    // divide the cover by the divisor
    Mvc_CoverDivideInternal( pCover, pDiv, &pQuo, &pRem );
    assert( Mvc_CoverReadCubeNum(pQuo) );

    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pRem );

    // check the trivial case
    if ( Mvc_CoverReadCubeNum(pQuo) == 1 )
    {
        eNode = Dec_FactorLF_rec( pFForm, pCover, pQuo );
        Mvc_CoverFree( pQuo );
        return eNode;
    }

    // make the quotient cube ABC_FREE
    Mvc_CoverMakeCubeFree( pQuo );

    // divide the cover by the quotient
    Mvc_CoverDivideInternal( pCover, pQuo, &pDiv, &pRem );

    // check the trivial case
    if ( Mvc_CoverIsCubeFree( pDiv ) )
    {
        eNodeDiv = Dec_Factor_rec( pFForm, pDiv );
        eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
        Mvc_CoverFree( pDiv );
        Mvc_CoverFree( pQuo );
        eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
        if ( Mvc_CoverReadCubeNum(pRem) == 0 )
        {
            Mvc_CoverFree( pRem );
            return eNodeAnd;
        }
        else
        {
            eNodeRem = Dec_Factor_rec( pFForm, pRem );
            Mvc_CoverFree( pRem );
            return Dec_GraphAddNodeOr( pFForm, eNodeAnd, eNodeRem );
        }
    }

    // get the common cube
    pCom = Mvc_CoverCommonCubeCover( pDiv );
    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pQuo );
    Mvc_CoverFree( pRem );

    // solve the simple problem
    eNode = Dec_FactorLF_rec( pFForm, pCover, pCom );
    Mvc_CoverFree( pCom );
    return eNode;
}